

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryFill
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,MemoryFill *curr)

{
  char **ptr;
  long *plVar1;
  Name memory;
  char *pcVar2;
  char *pcVar3;
  Address AVar4;
  char *pcVar5;
  Address AVar6;
  Flow *pFVar7;
  Address memorySize;
  undefined1 local_160 [8];
  MemoryInstanceInfo info;
  undefined1 local_130 [8];
  Flow dest;
  Flow size;
  Flow value;
  
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)local_130,
             &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
             *(Expression **)(curr + 0x10));
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&size.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
               *(Expression **)(curr + 0x18));
    if (value.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                ((Flow *)&dest.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
                 *(Expression **)(curr + 0x20));
      if (size.breakTo.super_IString.str._M_len == 0) {
        if (((long)((long)dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
            ) * -0x5555555555555555 + (long)local_130 != 1) {
LAB_0013205d:
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x52,"const Literal &wasm::Flow::getSingleValue()");
        }
        pcVar2 = (char *)wasm::Literal::getUnsigned();
        if (dest.breakTo.super_IString.str._M_str +
            ((long)((long)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
            ) * -0x5555555555555555 != (char *)0x1) goto LAB_0013205d;
        pcVar3 = (char *)wasm::Literal::getUnsigned();
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_160,this,(Name)*(string_view *)(curr + 0x28));
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        value.breakTo.super_IString.str._M_str = (char *)local_160;
        AVar4 = getMemorySize((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                              local_160,memory);
        pcVar5 = (char *)(AVar4.addr << 0x10);
        if (((pcVar5 < pcVar3 + (long)pcVar2) || (pcVar5 < pcVar2)) || (pcVar5 < pcVar3)) {
          (*(this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>).
            _vptr_ExpressionRunner[2])(this,"out of bounds memory access in memory.fill");
        }
        memorySize.addr = 0xaaaaaaaaaaaaaaab;
        if (size.breakTo.super_IString.str._M_str +
            ((long)((long)value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
            3) * -0x5555555555555555 != (char *)0x1) goto LAB_0013205d;
        if (value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
            super_IString.str._M_str != (char *)0x2) {
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x120,"int32_t wasm::Literal::geti32() const");
        }
        if (pcVar3 != (char *)0x0) {
          ptr = &info.name.super_IString.str._M_str;
          do {
            plVar1 = *(long **)(value.breakTo.super_IString.str._M_str + 0x200);
            info.name.super_IString.str._M_str = pcVar2;
            AVar6 = getFinalAddressWithoutOffset
                              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                               value.breakTo.super_IString.str._M_str,(Literal *)ptr,
                               (Index)AVar4.addr,memorySize);
            memorySize.addr = (address64_t)info.instance;
            (**(code **)(*plVar1 + 0xb0))
                      (plVar1,AVar6.addr,
                       (int)(char)value.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                       info.instance,info.name.super_IString.str._M_len);
            wasm::Literal::~Literal((Literal *)ptr);
            pcVar2 = pcVar2 + 1;
            pcVar3 = pcVar3 + -1;
          } while (pcVar3 != (char *)0x0);
        }
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)dest.breakTo.super_IString.str._M_str;
        wasm::Literal::Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems,(Literal *)&size);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)size.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      wasm::Literal::~Literal((Literal *)&size);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)size.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&value);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)value.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&value);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_130;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&dest);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)dest.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  pFVar7 = (Flow *)wasm::Literal::~Literal((Literal *)&dest);
  return pFVar7;
}

Assistant:

Flow visitMemoryFill(MemoryFill* curr) {
    NOTE_ENTER("MemoryFill");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(value);
    NOTE_EVAL1(size);
    Address destVal(dest.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    // FIXME: cheaper wrapping detection?
    if (destVal > memorySize * Memory::kPageSize ||
        sizeVal > memorySize * Memory::kPageSize ||
        destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.fill");
    }
    uint8_t val(value.getSingleValue().geti32());
    for (size_t i = 0; i < sizeVal; ++i) {
      info.interface()->store8(info.instance->getFinalAddressWithoutOffset(
                                 Literal(destVal + i), 1, memorySize),
                               val,
                               info.name);
    }
    return {};
  }